

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5StorageGetStmt(Fts5Storage *p,int eStmt,sqlite3_stmt **ppStmt,char **pzErrMsg)

{
  int iVar1;
  sqlite3_stmt *pStmt;
  Fts5Config *pFVar2;
  int iVar3;
  void *p_00;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  sqlite3_stmt **ppStmt_00;
  
  uVar9 = (ulong)(uint)eStmt;
  ppStmt_00 = p->aStmt + uVar9;
  iVar3 = 0;
  if (*ppStmt_00 != (sqlite3_stmt *)0x0) goto LAB_0018c89f;
  pFVar2 = p->pConfig;
  iVar3 = 7;
  switch(uVar9) {
  case 0:
  case 1:
    pcVar5 = sqlite3_mprintf((&PTR_anon_var_dwarf_26dac_001fb350)[uVar9],pFVar2->zContentExprlist,
                             pFVar2->zContent,pFVar2->zContentRowid,pFVar2->zContentRowid);
    break;
  case 2:
    pcVar5 = sqlite3_mprintf((&PTR_anon_var_dwarf_26dac_001fb350)[uVar9],pFVar2->zContentExprlist,
                             pFVar2->zContent,pFVar2->zContentRowid);
    break;
  case 3:
  case 4:
    iVar1 = pFVar2->nCol;
    p_00 = sqlite3_malloc64((long)(iVar1 * 2 + 3));
    if (p_00 == (void *)0x0) goto LAB_0018c89f;
    uVar4 = 0;
    for (lVar6 = 0; lVar6 <= iVar1; lVar6 = lVar6 + 1) {
      *(undefined2 *)((long)p_00 + uVar4) = 0x2c3f;
      uVar4 = uVar4 + 2;
    }
    *(undefined1 *)((long)p_00 + ((uVar4 & 0xffffffff) - 1)) = 0;
    pcVar5 = sqlite3_mprintf((&PTR_anon_var_dwarf_26dac_001fb350)[uVar9],pFVar2->zDb,pFVar2->zName,
                             p_00);
    sqlite3_free(p_00);
    break;
  default:
    pcVar5 = (&PTR_anon_var_dwarf_26dac_001fb350)[uVar9];
    pcVar8 = pFVar2->zDb;
    pcVar7 = pFVar2->zName;
    goto LAB_0018c9b8;
  case 10:
    pcVar5 = (&PTR_anon_var_dwarf_26dac_001fb350)[uVar9];
    pcVar7 = pFVar2->zContent;
    pcVar8 = pFVar2->zContentExprlist;
LAB_0018c9b8:
    pcVar5 = sqlite3_mprintf(pcVar5,pcVar8,pcVar7);
  }
  if (pcVar5 != (char *)0x0) {
    iVar3 = sqlite3_prepare_v3(pFVar2->db,pcVar5,-1,(uint)(2 < eStmt) * 4 + 1,ppStmt_00,(char **)0x0
                              );
    sqlite3_free(pcVar5);
    if ((pzErrMsg != (char **)0x0) && (iVar3 != 0)) {
      pcVar5 = sqlite3_errmsg(pFVar2->db);
      pcVar5 = sqlite3_mprintf("%s",pcVar5);
      *pzErrMsg = pcVar5;
    }
  }
LAB_0018c89f:
  pStmt = *ppStmt_00;
  *ppStmt = pStmt;
  sqlite3_reset(pStmt);
  return iVar3;
}

Assistant:

static int fts5StorageGetStmt(
  Fts5Storage *p,                 /* Storage handle */
  int eStmt,                      /* FTS5_STMT_XXX constant */
  sqlite3_stmt **ppStmt,          /* OUT: Prepared statement handle */
  char **pzErrMsg                 /* OUT: Error message (if any) */
){
  int rc = SQLITE_OK;

  /* If there is no %_docsize table, there should be no requests for 
  ** statements to operate on it.  */
  assert( p->pConfig->bColumnsize || (
        eStmt!=FTS5_STMT_REPLACE_DOCSIZE 
     && eStmt!=FTS5_STMT_DELETE_DOCSIZE 
     && eStmt!=FTS5_STMT_LOOKUP_DOCSIZE 
  ));

  assert( eStmt>=0 && eStmt<ArraySize(p->aStmt) );
  if( p->aStmt[eStmt]==0 ){
    const char *azStmt[] = {
      "SELECT %s FROM %s T WHERE T.%Q >= ? AND T.%Q <= ? ORDER BY T.%Q ASC",
      "SELECT %s FROM %s T WHERE T.%Q <= ? AND T.%Q >= ? ORDER BY T.%Q DESC",
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP  */

      "INSERT INTO %Q.'%q_content' VALUES(%s)",         /* INSERT_CONTENT  */
      "REPLACE INTO %Q.'%q_content' VALUES(%s)",        /* REPLACE_CONTENT */
      "DELETE FROM %Q.'%q_content' WHERE id=?",         /* DELETE_CONTENT  */
      "REPLACE INTO %Q.'%q_docsize' VALUES(?,?)",       /* REPLACE_DOCSIZE  */
      "DELETE FROM %Q.'%q_docsize' WHERE id=?",         /* DELETE_DOCSIZE  */

      "SELECT sz FROM %Q.'%q_docsize' WHERE id=?",      /* LOOKUP_DOCSIZE  */

      "REPLACE INTO %Q.'%q_config' VALUES(?,?)",        /* REPLACE_CONFIG */
      "SELECT %s FROM %s AS T",                         /* SCAN */
    };
    Fts5Config *pC = p->pConfig;
    char *zSql = 0;

    switch( eStmt ){
      case FTS5_STMT_SCAN:
        zSql = sqlite3_mprintf(azStmt[eStmt], 
            pC->zContentExprlist, pC->zContent
        );
        break;

      case FTS5_STMT_SCAN_ASC:
      case FTS5_STMT_SCAN_DESC:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zContentExprlist, 
            pC->zContent, pC->zContentRowid, pC->zContentRowid,
            pC->zContentRowid
        );
        break;

      case FTS5_STMT_LOOKUP:
        zSql = sqlite3_mprintf(azStmt[eStmt], 
            pC->zContentExprlist, pC->zContent, pC->zContentRowid
        );
        break;

      case FTS5_STMT_INSERT_CONTENT: 
      case FTS5_STMT_REPLACE_CONTENT: {
        int nCol = pC->nCol + 1;
        char *zBind;
        int i;

        zBind = sqlite3_malloc64(1 + nCol*2);
        if( zBind ){
          for(i=0; i<nCol; i++){
            zBind[i*2] = '?';
            zBind[i*2 + 1] = ',';
          }
          zBind[i*2-1] = '\0';
          zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName, zBind);
          sqlite3_free(zBind);
        }
        break;
      }

      default:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName);
        break;
    }

    if( zSql==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int f = SQLITE_PREPARE_PERSISTENT;
      if( eStmt>FTS5_STMT_LOOKUP ) f |= SQLITE_PREPARE_NO_VTAB;
      rc = sqlite3_prepare_v3(pC->db, zSql, -1, f, &p->aStmt[eStmt], 0);
      sqlite3_free(zSql);
      if( rc!=SQLITE_OK && pzErrMsg ){
        *pzErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pC->db));
      }
    }
  }

  *ppStmt = p->aStmt[eStmt];
  sqlite3_reset(*ppStmt);
  return rc;
}